

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::HlslParseContext::remapEntryPointIO
          (HlslParseContext *this,TFunction *function,TVariable **returnValue,
          TVector<glslang::TVariable_*> *inputs,TVector<glslang::TVariable_*> *outputs)

{
  ulong *puVar1;
  EShLanguage EVar2;
  uint uVar3;
  TType *type;
  TTypeList *pTVar4;
  _Base_ptr p_Var5;
  iterator __position;
  iterator iVar6;
  long *plVar7;
  char cVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TVariable *pTVar10;
  undefined4 extraout_var_01;
  TPoolAllocator *pTVar11;
  TSmallArrayVector *this_00;
  HlslParseContext *this_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *this_02;
  _func_int **pp_Var12;
  anon_union_8_2_8ac53c11_for_TType_13 this_03;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  mapped_type *pmVar13;
  long lVar14;
  _Rb_tree_header *p_Var15;
  _Rb_tree_header *p_Var16;
  uint uVar17;
  char *pcVar18;
  undefined8 *puVar19;
  anon_class_8_1_8991fb9c makeIoVariable;
  TType outputType;
  anon_class_8_1_8991fb9c local_f8;
  _Rb_tree_header *local_f0;
  TMap<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>_>
  *local_e8;
  _Rb_tree_header *local_e0;
  vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *local_d8;
  vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *local_d0;
  anon_union_8_2_8ac53c11_for_TType_13 local_c8;
  TString *pTStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  TSmallArrayVector *local_68;
  undefined4 extraout_var_02;
  
  local_f8.this = this;
  local_d8 = (vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)outputs;
  iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar9));
  if (iVar9 == 0) {
    *returnValue = (TVariable *)0x0;
  }
  else {
    EVar2 = (this->super_TParseContextBase).super_TParseVersions.language;
    iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    pTVar10 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                        (&local_f8,"@entryPointOutput",(TType *)CONCAT44(extraout_var_00,iVar9),
                         EvqVaryingOut);
    *returnValue = pTVar10;
    if (EVar2 == EShLangTessControl) {
      TType::TType((TType *)&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
      TType::shallowCopy((TType *)&local_c8,(TType *)CONCAT44(extraout_var_01,iVar9));
      pTVar11 = GetThreadPoolAllocator();
      this_00 = (TSmallArrayVector *)TPoolAllocator::allocate(pTVar11,0x18);
      this_00->_vptr_TSmallArrayVector = (_func_int **)&PTR__TSmallArrayVector_0093b5c8;
      this_00->sizes = (TVector<glslang::TArraySize> *)0x0;
      *(undefined4 *)&this_00[1]._vptr_TSmallArrayVector = 0;
      *(undefined2 *)((long)&this_00[1]._vptr_TSmallArrayVector + 4) = 1;
      TSmallArrayVector::push_back
                (this_00,((this->super_TParseContextBase).super_TParseVersions.intermediate)->
                         vertices,(TIntermTyped *)0x0);
      local_68 = this_00;
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
      this_01 = (HlslParseContext *)CONCAT44(extraout_var_02,iVar9);
      iVar9 = (*(this_01->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
      clearUniformInputOutput(this_01,(TQualifier *)CONCAT44(extraout_var_03,iVar9));
      pTVar10 = remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                          (&local_f8,"@entryPointOutput",(TType *)&local_c8,EvqVaryingOut);
      *returnValue = pTVar10;
    }
  }
  iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
  if (0 < iVar9) {
    local_e8 = &this->ioTypeMap;
    local_f0 = &(this->ioTypeMap).
                super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                ._M_t._M_impl.super__Rb_tree_header;
    uVar17 = 0;
    local_d0 = (vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>> *)inputs;
    do {
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar17);
      type = *(TType **)(CONCAT44(extraout_var_04,iVar9) + 8);
      iVar9 = (*type->_vptr_TType[10])(type);
      uVar3 = *(uint *)(CONCAT44(extraout_var_05,iVar9) + 8);
      if (((uVar3 & 0x7f) < 0x14) && ((0xd0000U >> (uVar3 & 0x1f) & 1) != 0)) {
        if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) &&
           ((((iVar9 = (*type->_vptr_TType[0x32])(type,8), (char)iVar9 != '\0' ||
              (iVar9 = (*type->_vptr_TType[0x32])(type,9), (char)iVar9 != '\0')) ||
             (iVar9 = (*type->_vptr_TType[0x32])(type,10), (char)iVar9 != '\0')) ||
            (((iVar9 = (*type->_vptr_TType[0x32])(type,0xb), (char)iVar9 != '\0' ||
              (iVar9 = (*type->_vptr_TType[0x32])(type,0xc), (char)iVar9 != '\0')) ||
             (iVar9 = (*type->_vptr_TType[0x32])(type,2), (char)iVar9 != '\0')))))) {
          iVar9 = (*type->_vptr_TType[0x25])(type);
          if ((char)iVar9 == '\0') {
            iVar9 = (*type->_vptr_TType[10])(type);
            puVar1 = (ulong *)(CONCAT44(extraout_var_06,iVar9) + 8);
            *puVar1 = *puVar1 & 0xfffff01f1fffffff;
            iVar9 = (*type->_vptr_TType[10])(type);
            puVar1 = (ulong *)(CONCAT44(extraout_var_07,iVar9) + 8);
            *puVar1 = *puVar1 | 0x80000000;
          }
          else {
            iVar9 = (*type->_vptr_TType[0x25])();
            if ((char)iVar9 == '\0') {
LAB_00386138:
              __assert_fail("isStruct()",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                            ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
            }
            pTVar4 = (type->field_13).structure;
            p_Var15 = local_f0;
            for (p_Var5 = (this->ioTypeMap).
                          super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                p_Var5 = (&p_Var5->_M_left)[*(TTypeList **)(p_Var5 + 1) < pTVar4]) {
              if (*(TTypeList **)(p_Var5 + 1) >= pTVar4) {
                p_Var15 = (_Rb_tree_header *)p_Var5;
              }
            }
            p_Var16 = local_f0;
            if ((p_Var15 != local_f0) &&
               (p_Var16 = p_Var15, pTVar4 < (TTypeList *)p_Var15->_M_node_count)) {
              p_Var16 = local_f0;
            }
            if ((p_Var16 == local_f0) ||
               (this_02 = *(vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> **)
                           (p_Var16 + 1),
               this_02 ==
               (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)0x0)) {
              local_e0 = p_Var16;
              pTVar11 = GetThreadPoolAllocator();
              this_02 = (vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> *)
                        TPoolAllocator::allocate(pTVar11,0x20);
              *(undefined8 *)this_02 = 0;
              *(undefined8 *)(this_02 + 8) = 0;
              *(undefined8 *)(this_02 + 0x10) = 0;
              *(undefined8 *)(this_02 + 0x18) = 0;
              pTVar11 = GetThreadPoolAllocator();
              *(TPoolAllocator **)this_02 = pTVar11;
              *(undefined8 *)(this_02 + 8) = 0;
              *(undefined8 *)(this_02 + 0x10) = 0;
              *(undefined8 *)(this_02 + 0x18) = 0;
              iVar9 = (*type->_vptr_TType[0x25])(type);
              if ((char)iVar9 == '\0') goto LAB_00386138;
              pp_Var12 = type->_vptr_TType;
              pcVar18 = *(char **)&((type->field_13).referentType)->field_0x8;
              while( true ) {
                iVar9 = (*pp_Var12[0x25])(type);
                if ((char)iVar9 == '\0') goto LAB_00386138;
                if (pcVar18 == (((type->field_13).referentType)->qualifier).semanticName) break;
                pTVar11 = GetThreadPoolAllocator();
                this_03.structure = (TTypeList *)TPoolAllocator::allocate(pTVar11,0x98);
                TType::TType(this_03.referentType,EbtVoid,EvqTemporary,1,0,0,false);
                TType::shallowCopy(this_03.referentType,*(TType **)pcVar18);
                uStack_b0 = *(undefined8 *)(pcVar18 + 0x18);
                pTStack_c0 = *(TString **)(pcVar18 + 8);
                uStack_b8 = *(undefined8 *)(pcVar18 + 0x10);
                __position._M_current = *(TTypeLoc **)(this_02 + 0x10);
                local_c8.structure = this_03.structure;
                if (__position._M_current == *(TTypeLoc **)(this_02 + 0x18)) {
                  std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>::
                  _M_realloc_insert<glslang::TTypeLoc_const&>
                            (this_02,__position,(TTypeLoc *)&local_c8);
                }
                else {
                  ((__position._M_current)->loc).string = (int)uStack_b8;
                  ((__position._M_current)->loc).line = (int)((ulong)uStack_b8 >> 0x20);
                  *(undefined8 *)&((__position._M_current)->loc).column = uStack_b0;
                  (__position._M_current)->type = (TType *)this_03;
                  ((__position._M_current)->loc).name = pTStack_c0;
                  *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 0x20;
                }
                pcVar18 = pcVar18 + 0x20;
                pp_Var12 = type->_vptr_TType;
              }
              if (local_e0 == local_f0) {
                iVar9 = (*type->_vptr_TType[0x25])(type);
                if ((char)iVar9 == '\0') goto LAB_00386138;
                local_c8 = type->field_13;
                pmVar13 = std::
                          map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                          ::operator[](&local_e8->
                                        super_map<const_glslang::TVector<glslang::TTypeLoc>_*,_glslang::HlslParseContext::tIoKinds,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_glslang::HlslParseContext::tIoKinds>_>_>
                                       ,&local_c8.structure);
                pmVar13->input = (TTypeList *)this_02;
                pmVar13->output = (TTypeList *)0x0;
                pmVar13->uniform = (TTypeList *)0x0;
              }
              else {
                *(vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>> **)
                 (local_e0 + 1) = this_02;
              }
            }
            for (puVar19 = *(undefined8 **)(this_02 + 8);
                puVar19 != *(undefined8 **)(this_02 + 0x10); puVar19 = puVar19 + 4) {
              plVar7 = (long *)*puVar19;
              cVar8 = (**(code **)(*plVar7 + 400))(plVar7,8);
              if (((((cVar8 != '\0') ||
                    (cVar8 = (**(code **)(*plVar7 + 400))(plVar7,9), cVar8 != '\0')) ||
                   (cVar8 = (**(code **)(*plVar7 + 400))(plVar7,10), cVar8 != '\0')) ||
                  ((cVar8 = (**(code **)(*plVar7 + 400))(plVar7,0xb), cVar8 != '\0' ||
                   (cVar8 = (**(code **)(*plVar7 + 400))(plVar7,0xc), cVar8 != '\0')))) ||
                 (cVar8 = (**(code **)(*plVar7 + 400))(plVar7,2), cVar8 != '\0')) {
                lVar14 = (**(code **)(*(long *)*puVar19 + 0x50))();
                *(ulong *)(lVar14 + 8) = *(ulong *)(lVar14 + 8) & 0xfffff01f1fffffff;
                lVar14 = (**(code **)(*(long *)*puVar19 + 0x50))();
                *(ulong *)(lVar14 + 8) = *(ulong *)(lVar14 + 8) | 0x80000000;
              }
            }
          }
        }
        iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar17);
        local_c8.structure =
             (TTypeList *)
             remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       (&local_f8,*(char **)(*(long *)CONCAT44(extraout_var_08,iVar9) + 8),type,
                        EvqVaryingIn);
        iVar6._M_current = *(TVariable ***)(local_d0 + 0x10);
        if (iVar6._M_current == *(TVariable ***)(local_d0 + 0x18)) {
          std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
          _M_realloc_insert<glslang::TVariable*const&>
                    (local_d0,iVar6,(TVariable **)&local_c8.structure);
        }
        else {
          *iVar6._M_current = (TVariable *)local_c8;
          *(long *)(local_d0 + 0x10) = *(long *)(local_d0 + 0x10) + 8;
        }
      }
      iVar9 = (*type->_vptr_TType[10])(type);
      if ((*(uint *)(CONCAT44(extraout_var_09,iVar9) + 8) & 0x7f) - 0x11 < 2) {
        iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar17);
        local_c8.structure =
             (TTypeList *)
             remapEntryPointIO::anon_class_8_1_8991fb9c::operator()
                       (&local_f8,*(char **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 8),type,
                        EvqVaryingOut);
        iVar6._M_current = *(TVariable ***)(local_d8 + 0x10);
        if (iVar6._M_current == *(TVariable ***)(local_d8 + 0x18)) {
          std::vector<glslang::TVariable*,glslang::pool_allocator<glslang::TVariable*>>::
          _M_realloc_insert<glslang::TVariable*const&>
                    (local_d8,iVar6,(TVariable **)&local_c8.structure);
        }
        else {
          *iVar6._M_current = (TVariable *)local_c8;
          *(long *)(local_d8 + 0x10) = *(long *)(local_d8 + 0x10) + 8;
        }
      }
      uVar17 = uVar17 + 1;
      iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    } while ((int)uVar17 < iVar9);
  }
  return;
}

Assistant:

void HlslParseContext::remapEntryPointIO(TFunction& function, TVariable*& returnValue,
    TVector<TVariable*>& inputs, TVector<TVariable*>& outputs)
{
    // We might have in input structure type with no decorations that caused it
    // to look like an input type, yet it has (e.g.) interpolation types that
    // must be modified that turn it into an input type.
    // Hence, a missing ioTypeMap for 'input' might need to be synthesized.
    const auto synthesizeEditedInput = [this](TType& type) {
        // True if a type needs to be 'flat'
        const auto needsFlat = [](const TType& type) {
            return type.containsBasicType(EbtInt) ||
                    type.containsBasicType(EbtUint) ||
                    type.containsBasicType(EbtInt64) ||
                    type.containsBasicType(EbtUint64) ||
                    type.containsBasicType(EbtBool) ||
                    type.containsBasicType(EbtDouble);
        };

        if (language == EShLangFragment && needsFlat(type)) {
            if (type.isStruct()) {
                TTypeList* finalList = nullptr;
                auto it = ioTypeMap.find(type.getStruct());
                if (it == ioTypeMap.end() || it->second.input == nullptr) {
                    // Getting here means we have no input struct, but we need one.
                    auto list = new TTypeList;
                    for (auto member = type.getStruct()->begin(); member != type.getStruct()->end(); ++member) {
                        TType* newType = new TType;
                        newType->shallowCopy(*member->type);
                        TTypeLoc typeLoc = { newType, member->loc };
                        list->push_back(typeLoc);
                    }
                    // install the new input type
                    if (it == ioTypeMap.end()) {
                        tIoKinds newLists = { list, nullptr, nullptr };
                        ioTypeMap[type.getStruct()] = newLists;
                    } else
                        it->second.input = list;
                    finalList = list;
                } else
                    finalList = it->second.input;
                // edit for 'flat'
                for (auto member = finalList->begin(); member != finalList->end(); ++member) {
                    if (needsFlat(*member->type)) {
                        member->type->getQualifier().clearInterpolation();
                        member->type->getQualifier().flat = true;
                    }
                }
            } else {
                type.getQualifier().clearInterpolation();
                type.getQualifier().flat = true;
            }
        }
    };

    // Do the actual work to make a type be a shader input or output variable,
    // and clear the original to be non-IO (for use as a normal function parameter/return).
    const auto makeIoVariable = [this](const char* name, TType& type, TStorageQualifier storage) -> TVariable* {
        TVariable* ioVariable = makeInternalVariable(name, type);
        clearUniformInputOutput(type.getQualifier());
        if (type.isStruct()) {
            auto newLists = ioTypeMap.find(ioVariable->getType().getStruct());
            if (newLists != ioTypeMap.end()) {
                if (storage == EvqVaryingIn && newLists->second.input)
                    ioVariable->getWritableType().setStruct(newLists->second.input);
                else if (storage == EvqVaryingOut && newLists->second.output)
                    ioVariable->getWritableType().setStruct(newLists->second.output);
            }
        }
        if (storage == EvqVaryingIn) {
            correctInput(ioVariable->getWritableType().getQualifier());
            if (language == EShLangTessEvaluation)
                if (!ioVariable->getType().isArray())
                    ioVariable->getWritableType().getQualifier().patch = true;
        } else {
            correctOutput(ioVariable->getWritableType().getQualifier());
        }
        ioVariable->getWritableType().getQualifier().storage = storage;

        fixBuiltInIoType(ioVariable->getWritableType());

        return ioVariable;
    };

    // return value is actually a shader-scoped output (out)
    if (function.getType().getBasicType() == EbtVoid) {
        returnValue = nullptr;
    } else {
        if (language == EShLangTessControl) {
            // tessellation evaluation in HLSL writes a per-ctrl-pt value, but it needs to be an
            // array in SPIR-V semantics.  We'll write to it indexed by invocation ID.

            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);

            TType outputType;
            outputType.shallowCopy(function.getType());

            // vertices has necessarily already been set when handling entry point attributes.
            TArraySizes* arraySizes = new TArraySizes;
            arraySizes->addInnerSize(intermediate.getVertices());
            outputType.transferArraySizes(arraySizes);

            clearUniformInputOutput(function.getWritableType().getQualifier());
            returnValue = makeIoVariable("@entryPointOutput", outputType, EvqVaryingOut);
        } else {
            returnValue = makeIoVariable("@entryPointOutput", function.getWritableType(), EvqVaryingOut);
        }
    }

    // parameters are actually shader-scoped inputs and outputs (in or out)
    for (int i = 0; i < function.getParamCount(); i++) {
        TType& paramType = *function[i].type;
        if (paramType.getQualifier().isParamInput()) {
            synthesizeEditedInput(paramType);
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingIn);
            inputs.push_back(argAsGlobal);
        }
        if (paramType.getQualifier().isParamOutput()) {
            TVariable* argAsGlobal = makeIoVariable(function[i].name->c_str(), paramType, EvqVaryingOut);
            outputs.push_back(argAsGlobal);
        }
    }
}